

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O2

void __thiscall KktChStep::resizeProblemMatrix(KktChStep *this,KktCheck *checker)

{
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer piVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  pointer pdVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  allocator_type local_b5;
  value_type local_b4;
  vector<int,_std::allocator<int>_> iwork;
  vector<int,_std::allocator<int>_> cIndex;
  vector<int,_std::allocator<int>_> rIndex;
  vector<int,_std::allocator<int>_> nzRow;
  
  rIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&nzRow,(long)this->RnumRow,(value_type *)&rIndex,(allocator_type *)&cIndex);
  piVar4 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar15 = 0;
  while( true ) {
    iVar17 = this->RnumRow;
    if (iVar17 <= lVar15) break;
    if (piVar5[lVar15] != 0) {
      piVar6 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar18 = (long)piVar4[lVar15]; lVar18 < piVar4[lVar15 + 1]; lVar18 = lVar18 + 1) {
        if (piVar7[piVar6[lVar18]] != 0) {
          nzRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar15] =
               nzRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar15] + 1;
        }
      }
    }
    lVar15 = lVar15 + 1;
  }
  this->numRow = iVar17;
  this->numCol = this->RnumCol;
  cIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&rIndex,(long)iVar17,(value_type *)&cIndex,(allocator_type *)&iwork);
  iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_
       = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&cIndex,(long)this->numCol,(value_type *)&iwork,(allocator_type *)&local_b4);
  piVar4 = (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar22 = 0;
  iVar17 = 0;
  for (lVar15 = 0; lVar15 < this->numRow; lVar15 = lVar15 + 1) {
    if (piVar4[lVar15] != 0) {
      iVar17 = iVar17 + nzRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar15];
      *(int *)(CONCAT44(rIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        rIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + lVar15 * 4) = iVar22;
      iVar22 = iVar22 + 1;
    }
  }
  piVar4 = (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar21 = 0;
  for (lVar15 = 0; lVar15 < this->numCol; lVar15 = lVar15 + 1) {
    if (piVar4[lVar15] != 0) {
      *(int *)(CONCAT44(cIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        cIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + lVar15 * 4) = iVar21;
      iVar21 = iVar21 + 1;
    }
  }
  KktCheck::setIndexVectors(checker,&rIndex,&cIndex);
  uVar2 = this->numCol;
  uVar3 = this->numRow;
  this->numRow = iVar22;
  this->numCol = iVar21;
  local_b4 = 0;
  std::vector<int,_std::allocator<int>_>::vector(&iwork,(long)iVar21,&local_b4,&local_b5);
  this_00 = &this->Astart;
  local_b4 = 0;
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)this->numCol + 1,&local_b4);
  std::vector<int,_std::allocator<int>_>::resize(&this->Aindex,(long)iVar17);
  std::vector<double,_std::allocator<double>_>::resize(&this->Avalue,(long)iVar17);
  piVar4 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar16 = 0;
  uVar20 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar20 = uVar16;
  }
  for (; uVar16 != uVar20; uVar16 = uVar16 + 1) {
    if (piVar5[uVar16] != 0) {
      piVar6 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar15 = (long)piVar4[uVar16]; lVar15 < piVar4[uVar16 + 1]; lVar15 = lVar15 + 1) {
        lVar18 = (long)piVar6[lVar15];
        if (piVar7[lVar18] != 0) {
          piVar1 = (int *)(CONCAT44(iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_) +
                          (long)*(int *)(CONCAT44(cIndex.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  cIndex.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                        lVar18 * 4) * 4);
          *piVar1 = *piVar1 + 1;
        }
      }
    }
  }
  piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar15 = 1; uVar16 = (ulong)this->numCol, lVar15 <= (long)uVar16; lVar15 = lVar15 + 1) {
    piVar4[lVar15] =
         *(int *)(CONCAT44(iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_) + -4 + lVar15 * 4) +
         piVar4[lVar15 + -1];
  }
  piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar15 = 0; lVar15 < (int)uVar16; lVar15 = lVar15 + 1) {
    *(int *)(CONCAT44(iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_) + lVar15 * 4) = piVar4[lVar15];
    uVar16 = (ulong)(uint)this->numCol;
  }
  piVar4 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar16 = 0; uVar16 != uVar20; uVar16 = uVar16 + 1) {
    if (piVar5[uVar16] != 0) {
      iVar17 = *(int *)(CONCAT44(rIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 rIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_4_) + uVar16 * 4);
      piVar6 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar9 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar15 = (long)piVar4[uVar16]; lVar15 < piVar4[uVar16 + 1]; lVar15 = lVar15 + 1) {
        lVar18 = (long)piVar6[lVar15];
        if (piVar7[lVar18] != 0) {
          lVar18 = (long)*(int *)(CONCAT44(cIndex.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                                           cIndex.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                 lVar18 * 4);
          iVar22 = *(int *)(CONCAT44(iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_) + lVar18 * 4);
          *(int *)(CONCAT44(iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + lVar18 * 4) = iVar22 + 1;
          piVar9[iVar22] = iVar17;
          pdVar10[iVar22] = pdVar8[lVar15];
        }
      }
    }
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->colCost,(long)this->numCol);
  std::vector<double,_std::allocator<double>_>::resize(&this->colLower,(long)this->numCol);
  std::vector<double,_std::allocator<double>_>::resize(&this->colUpper,(long)this->numCol);
  piVar4 = (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->RcolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar10 = (this->RcolLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar11 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar13 = (this->RcolUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar14 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar19 = 0;
  uVar16 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar16 = uVar19;
  }
  iVar17 = 0;
  for (; uVar16 != uVar19; uVar19 = uVar19 + 1) {
    if (piVar4[uVar19] != 0) {
      pdVar11[iVar17] = pdVar8[uVar19];
      pdVar12[iVar17] = pdVar10[uVar19];
      pdVar14[iVar17] = pdVar13[uVar19];
      iVar17 = iVar17 + 1;
    }
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->rowLower,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(&this->rowUpper,(long)this->numRow);
  piVar4 = (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->RrowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar10 = (this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar11 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar17 = 0;
  for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
    if (piVar4[uVar16] != 0) {
      pdVar11[iVar17] = pdVar10[uVar16];
      pdVar12[iVar17] = pdVar8[uVar16];
      iVar17 = iVar17 + 1;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&iwork.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&cIndex.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&rIndex.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&nzRow.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void KktChStep::resizeProblemMatrix(KktCheck& checker) {
	//full matrix data in AR copy, A copy made to be passed to checker
	int i, j, k;
	int nz = 0;
	int nR = 0;
	int nC = 0;
	
	//nzRow is the current # on nonzeros, not the general one! 
	vector<int> nzRow(RnumRow, 0);
	for (i=0;i<RnumRow;i++) 
		if (flagRow[i])
			for (k=ARstart[i]; k<ARstart[i+1]; k++) 
				if (flagCol[ARindex[k]]) 
					nzRow[i]++;
	
	numRow = RnumRow;
	numCol = RnumCol;
	//arrays to keep track of indices
	vector<int> rIndex(numRow, -1);
	vector<int> cIndex(numCol, -1);
		 
	for (i=0;i<numRow;i++)
		if (flagRow[i]) {
			nz += nzRow[i];
			rIndex[i] = nR;
			nR++;
			}
			
	for (i=0;i<numCol;i++)
		if (flagCol[i]) {
			cIndex[i] = nC;
			nC++;
		}

	//set indices for checker
	checker.setIndexVectors(rIndex, cIndex);
		
	//counts		
	int numRowEq = numRow;
	int numColEq = numCol;
	numRow = nR;
	numCol = nC;
	
	//matrix
    vector<int> iwork(numCol, 0);
    Astart.resize(numCol + 1, 0);
    Aindex.resize(nz);
    Avalue.resize(nz);
    
        
    for (i = 0;i<numRowEq; i++) 
    	if (flagRow[i])
    	    for (int k = ARstart[i]; k < ARstart[i+1]; k++) {
    	    	j = ARindex[k];
    	    	if (flagCol[j])
        			iwork[cIndex[j]]++;
        		}     
    for (i = 1; i <= numCol; i++)
        Astart[i] = Astart[i - 1] + iwork[i - 1];
    for (i = 0; i < numCol; i++)
        iwork[i] = Astart[i];
    for (i = 0; i < numRowEq; i++) {
    	if (flagRow[i]) {
			int iRow = rIndex[i];
		    for (k = ARstart[i]; k < ARstart[i + 1]; k++) {
		        j = ARindex[k];
		        if (flagCol[j]) {
		        	int iCol = cIndex[j];
				    int iPut = iwork[iCol]++;
				    Aindex[iPut] = iRow;
				    Avalue[iPut] = ARvalue[k];
				}
		    }
		}
    }
	
	//resize cost, RHS, bounds    
    colCost.resize(numCol);
    colLower.resize(numCol);
    colUpper.resize(numCol);
    
    k=0;
    for (i=0;i<numColEq;i++) 
    	if (flagCol[i]) {
    		colCost[k]  = RcolCost[i];
    		colLower[k] = RcolLower[i];
    		colUpper[k] = RcolUpper[i];
    		k++;
	    }
    
    rowLower.resize(numRow);
    rowUpper.resize(numRow);

    k=0;
    for (i=0;i<numRowEq;i++) 
    	if (flagRow[i]) {
    		rowUpper[k] = RrowUpper[i];
    		rowLower[k] = RrowLower[i];

    		//b[k] = Rb[i];
    		k++;
	    }
	
	
		
}